

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upsync_module.c
# Opt level: O3

int ngx_http_status(http_parser *p,char *buf,size_t len)

{
  int iVar1;
  
  if (parser == p) {
    memcpy(&state,buf,len);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
    if (3 < ngx_cycle->log->log_level) {
      ngx_log_error_core(4,ngx_cycle->log,0,"ngx_http_status: parser argument is wrong");
    }
  }
  return iVar1;
}

Assistant:

static int
ngx_http_status(http_parser *p, const char *buf, size_t len)
{
    if (p != parser) {
        ngx_log_error(NGX_LOG_ERR, ngx_cycle->log, 0,
                      "ngx_http_status: parser argument is wrong");
        return NGX_ERROR;
    }

    ngx_memcpy(state.status, buf, len);

    return 0;
}